

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

uint * Kit_DsdTruthComputeNodeTwo_rec
                 (Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,int Id,uint uSupp,int iVar,uint *pTruthDec)

{
  ushort uVar1;
  Kit_DsdObj_t KVar2;
  uint uVar3;
  int iVar4;
  Kit_DsdObj_t *pKVar5;
  uint *pOut;
  uint *puVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint *pOut_00;
  uint uVar12;
  uint *pTruthFans [16];
  int pfBoundSet [16];
  uint *local_f8 [16];
  uint auStack_78 [18];
  
  if (uSupp == 0) {
    __assert_fail("uSupp > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                  ,0x35d,
                  "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                 );
  }
  puVar6 = pTruthDec;
  pKVar5 = Kit_DsdNtkObj(pNtk,Id);
  pOut = (uint *)Vec_PtrEntry(p->vTtNodes,Id);
  if (pKVar5 == (Kit_DsdObj_t *)0x0) {
    if (Id < (int)(uint)pNtk->nVars) {
      return pOut;
    }
    __assert_fail("Id < pNtk->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                  ,0x364,
                  "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                 );
  }
  KVar2 = *pKVar5;
  uVar8 = (uint)KVar2 >> 6 & 7;
  if (uVar8 == 1) {
    __assert_fail("pObj->Type != KIT_DSD_CONST1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                  ,0x367,
                  "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                 );
  }
  if (uVar8 == 2) {
    __assert_fail("pObj->Type != KIT_DSD_VAR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                  ,0x368,
                  "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                 );
  }
  uVar8 = 0;
  uVar12 = 0;
  for (uVar11 = 0; uVar9 = (uint)KVar2 >> 0x1a, uVar11 < uVar9; uVar11 = uVar11 + 1) {
    uVar3 = Kit_DsdLitSupport(pNtk,(uint)*(ushort *)(&pKVar5[1].field_0x0 + uVar11 * 2));
    uVar10 = uVar3 & uSupp;
    uVar9 = uVar10;
    if (uVar10 != 0) {
      uVar9 = uVar3;
    }
    uVar8 = uVar8 + (uVar10 != 0);
    uVar12 = uVar12 | uVar9;
    KVar2 = *pKVar5;
  }
  if (uVar8 == 0 || uVar8 == uVar9) {
    puVar6 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,Id,0);
    return puVar6;
  }
  if ((uVar12 & ~uSupp) == 0) {
    if (uVar9 <= uVar8) {
      __assert_fail("nPartial < pObj->nFans",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                    ,0x3a4,
                    "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                   );
    }
    for (uVar11 = 0; uVar11 < (uint)KVar2 >> 0x1a; uVar11 = uVar11 + 1) {
      uVar1 = *(ushort *)(&pKVar5[1].field_0x0 + uVar11 * 2);
      iVar4 = Abc_Lit2Var((uint)uVar1);
      puVar7 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,iVar4,0);
      local_f8[uVar11] = puVar7;
      uVar12 = Kit_DsdLitSupport(pNtk,(uint)uVar1);
      auStack_78[uVar11] = (uint)((uVar12 & uSupp) != 0);
      KVar2 = *pKVar5;
    }
    uVar12 = (uint)KVar2 >> 6 & 7;
    if (uVar12 == 5) {
      if (uVar8 != 1) {
        __assert_fail("nPartial == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                      ,0x3cd,
                      "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                     );
      }
      uVar11 = 0;
      while( true ) {
        if ((uint)KVar2 >> 0x1a == uVar11) {
          __assert_fail("i < pObj->nFans",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                        ,0x3d3,
                        "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                       );
        }
        if (auStack_78[uVar11] != 0) break;
        uVar11 = uVar11 + 1;
      }
      puVar6 = local_f8[uVar11];
      Kit_TruthCopy(pTruthDec,puVar6,(uint)pNtk->nVars);
      Kit_TruthIthVar(puVar6,(uint)pNtk->nVars,iVar);
LAB_004c95f0:
      uVar11 = 0;
      while( true ) {
        KVar2 = *pKVar5;
        if ((uint)KVar2 >> 0x1a <= uVar11) break;
        iVar4 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar5[1].field_0x0 + uVar11 * 2));
        if (iVar4 != 0) {
          Kit_TruthNot(local_f8[uVar11],local_f8[uVar11],(uint)pNtk->nVars);
        }
        uVar11 = uVar11 + 1;
      }
      puVar6 = (uint *)0x0;
      if (((uint)KVar2 & 0x1c0) == 0x140) {
        puVar6 = (uint *)(&pKVar5[1].field_0x0 + ((uint)KVar2 >> 8 & 0x3fc));
      }
      puVar6 = Kit_TruthCompose(p->dd,puVar6,(uint)KVar2 >> 0x1a,local_f8,(uint)pNtk->nVars,
                                p->vTtBdds,p->vNodes);
      Kit_TruthCopy(pOut,puVar6,(uint)pNtk->nVars);
      return pOut;
    }
    if (uVar12 != 4) {
      if (uVar12 == 3) {
        Kit_TruthIthVar(pOut,(uint)pNtk->nVars,iVar);
        Kit_TruthFill(pTruthDec,(uint)pNtk->nVars);
        for (uVar11 = 0; uVar11 < (uint)*pKVar5 >> 0x1a; uVar11 = uVar11 + 1) {
          uVar8 = auStack_78[uVar11];
          puVar7 = local_f8[uVar11];
          uVar1 = pNtk->nVars;
          iVar4 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar5[1].field_0x0 + uVar11 * 2));
          pOut_00 = pOut;
          if (uVar8 != 0) {
            pOut_00 = pTruthDec;
          }
          Kit_TruthAndPhase(pOut_00,pOut_00,puVar7,(uint)uVar1,iVar4,(int)puVar6);
        }
        return pOut;
      }
      __assert_fail("pObj->Type == KIT_DSD_PRIME",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                    ,0x3cc,
                    "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                   );
    }
    Kit_TruthIthVar(pOut,(uint)pNtk->nVars,iVar);
    Kit_TruthClear(pTruthDec,(uint)pNtk->nVars);
    uVar8 = 0;
    for (uVar11 = 0; uVar11 < (uint)*pKVar5 >> 0x1a; uVar11 = uVar11 + 1) {
      uVar12 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar5[1].field_0x0 + uVar11 * 2));
      puVar6 = pOut;
      if (auStack_78[uVar11] != 0) {
        puVar6 = pTruthDec;
      }
      Kit_TruthXor(puVar6,puVar6,local_f8[uVar11],(uint)pNtk->nVars);
      uVar8 = uVar8 ^ uVar12;
    }
  }
  else {
    if (uVar8 != 1) {
      __assert_fail("nPartial == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                    ,0x380,
                    "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                   );
    }
    for (uVar11 = 0; uVar11 < (uint)KVar2 >> 0x1a; uVar11 = uVar11 + 1) {
      uVar1 = *(ushort *)(&pKVar5[1].field_0x0 + uVar11 * 2);
      uVar8 = Kit_DsdLitSupport(pNtk,(uint)uVar1);
      iVar4 = Abc_Lit2Var((uint)uVar1);
      if ((uVar8 & uSupp) == 0) {
        puVar7 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,iVar4,0);
      }
      else {
        puVar6 = pTruthDec;
        puVar7 = Kit_DsdTruthComputeNodeTwo_rec(p,pNtk,iVar4,uSupp,iVar,pTruthDec);
      }
      local_f8[uVar11] = puVar7;
      KVar2 = *pKVar5;
    }
    uVar8 = (uint)KVar2 >> 6 & 7;
    if (uVar8 == 5) goto LAB_004c95f0;
    if (uVar8 != 4) {
      if (uVar8 == 3) {
        Kit_TruthFill(pOut,(uint)pNtk->nVars);
        for (uVar11 = 0; uVar11 < (uint)*pKVar5 >> 0x1a; uVar11 = uVar11 + 1) {
          puVar7 = local_f8[uVar11];
          uVar1 = pNtk->nVars;
          iVar4 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar5[1].field_0x0 + uVar11 * 2));
          Kit_TruthAndPhase(pOut,pOut,puVar7,(uint)uVar1,iVar4,(int)puVar6);
        }
        return pOut;
      }
      __assert_fail("pObj->Type == KIT_DSD_PRIME",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                    ,0x39f,
                    "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                   );
    }
    Kit_TruthClear(pOut,(uint)pNtk->nVars);
    uVar8 = 0;
    for (uVar11 = 0; uVar11 < (uint)*pKVar5 >> 0x1a; uVar11 = uVar11 + 1) {
      uVar12 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar5[1].field_0x0 + uVar11 * 2));
      uVar8 = uVar8 ^ uVar12;
      Kit_TruthXor(pOut,pOut,local_f8[uVar11],(uint)pNtk->nVars);
    }
  }
  if (uVar8 != 0) {
    Kit_TruthNot(pOut,pOut,(uint)pNtk->nVars);
  }
  return pOut;
}

Assistant:

unsigned * Kit_DsdTruthComputeNodeTwo_rec( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, int Id, unsigned uSupp, int iVar, unsigned * pTruthDec )
{
    Kit_DsdObj_t * pObj;
    int pfBoundSet[16];
    unsigned * pTruthRes, * pTruthFans[16], * pTruthTemp;
    unsigned i, iLit, fCompl, nPartial, uSuppFan, uSuppCur;
//    unsigned m, nMints, * pTruthPrime, * pTruthMint; 
    assert( uSupp > 0 );

    // get the node with this ID
    pObj = Kit_DsdNtkObj( pNtk, Id );
    pTruthRes = (unsigned *)Vec_PtrEntry( p->vTtNodes, Id );
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        return pTruthRes;
    }
    assert( pObj->Type != KIT_DSD_CONST1 );
    assert( pObj->Type != KIT_DSD_VAR );

    // count the number of intersecting fanins 
    // collect the total support of the intersecting fanins
    nPartial = 0;
    uSuppFan = 0;
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
    {
        uSuppCur = Kit_DsdLitSupport(pNtk, iLit);
        if ( uSupp & uSuppCur )
        {
            nPartial++;
            uSuppFan |= uSuppCur;
        }
    }

    // if there is no intersection, or full intersection, use simple procedure
    if ( nPartial == 0 || nPartial == pObj->nFans )
        return Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Id, 0 );

    // if support of the component includes some other variables
    // we need to continue constructing it as usual by the two-function procedure
    if ( uSuppFan != (uSuppFan & uSupp) )
    {
        assert( nPartial == 1 );
//        return Kit_DsdTruthComputeNodeTwo_rec( p, pNtk, Id, uSupp, iVar, pTruthDec );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            if ( uSupp & Kit_DsdLitSupport(pNtk, iLit) )
                pTruthFans[i] = Kit_DsdTruthComputeNodeTwo_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp, iVar, pTruthDec );
            else
                pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), 0 );
        }

        // create composition/decomposition functions
        if ( pObj->Type == KIT_DSD_AND )
        {
            Kit_TruthFill( pTruthRes, pNtk->nVars );
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
                Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
            return pTruthRes;
        }
        if ( pObj->Type == KIT_DSD_XOR )
        {
            Kit_TruthClear( pTruthRes, pNtk->nVars );
            fCompl = 0;
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            {
                fCompl ^= Abc_LitIsCompl(iLit);
                Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
            }
            if ( fCompl )
                Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
            return pTruthRes;
        }
        assert( pObj->Type == KIT_DSD_PRIME );
    }
    else
    {
        assert( uSuppFan == (uSuppFan & uSupp) );
        assert( nPartial < pObj->nFans );
        // the support of the insecting component(s) is contained in the bound-set
        // and yet there are components that are not contained in the bound set

        // solve the fanins and collect info, which components belong to the bound set
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), 0 );
            pfBoundSet[i] = (int)((uSupp & Kit_DsdLitSupport(pNtk, iLit)) > 0);
        }

        // create composition/decomposition functions
        if ( pObj->Type == KIT_DSD_AND )
        {
            Kit_TruthIthVar( pTruthRes, pNtk->nVars, iVar );
            Kit_TruthFill( pTruthDec, pNtk->nVars );
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
                if ( pfBoundSet[i] )
                    Kit_TruthAndPhase( pTruthDec, pTruthDec, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
                else
                    Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
            return pTruthRes;
        }
        if ( pObj->Type == KIT_DSD_XOR )
        {
            Kit_TruthIthVar( pTruthRes, pNtk->nVars, iVar );
            Kit_TruthClear( pTruthDec, pNtk->nVars );
            fCompl = 0;
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            {
                fCompl ^= Abc_LitIsCompl(iLit);
                if ( pfBoundSet[i] )
                    Kit_TruthXor( pTruthDec, pTruthDec, pTruthFans[i], pNtk->nVars );
                else
                    Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
            }
            if ( fCompl )
                Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
            return pTruthRes;
        }
        assert( pObj->Type == KIT_DSD_PRIME );
        assert( nPartial == 1 );

        // find the only non-empty component
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( pfBoundSet[i] )
                break;
        assert( i < pObj->nFans );

        // save this component as the decomposed function
        Kit_TruthCopy( pTruthDec, pTruthFans[i], pNtk->nVars );
        // set the corresponding component to be the new variable
        Kit_TruthIthVar( pTruthFans[i], pNtk->nVars, iVar );
    }
/*
    // get the truth table of the prime node
    pTruthPrime = Kit_DsdObjTruth( pObj );
    // get storage for the temporary minterm
    pTruthMint = Vec_PtrEntry(p->vTtNodes, pNtk->nVars + pNtk->nNodes);
    // go through the minterms
    nMints = (1 << pObj->nFans);
    Kit_TruthClear( pTruthRes, pNtk->nVars );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !Kit_TruthHasBit(pTruthPrime, m) )
            continue;
        Kit_TruthFill( pTruthMint, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthMint, pTruthMint, pTruthFans[i], pNtk->nVars, 0, ((m & (1<<i)) == 0) ^ Abc_LitIsCompl(iLit) );
        Kit_TruthOr( pTruthRes, pTruthRes, pTruthMint, pNtk->nVars );
    }
*/
//    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
//        assert( !Abc_LitIsCompl(iLit) );
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthFans[i], pTruthFans[i], pNtk->nVars );
    pTruthTemp = Kit_TruthCompose( p->dd, Kit_DsdObjTruth(pObj), pObj->nFans, pTruthFans, pNtk->nVars, p->vTtBdds, p->vNodes );
    Kit_TruthCopy( pTruthRes, pTruthTemp, pNtk->nVars );
    return pTruthRes;
}